

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_ecdsa_adaptor_sign
              (secp256k1_context *ctx,uchar *adaptor_sig65,uchar *adaptor_proof97,uchar *seckey32,
              secp256k1_pubkey *adaptor,uchar *msg32)

{
  int iVar1;
  int local_3cc;
  undefined1 local_3c8 [4];
  int overflow;
  secp256k1_scalar sp;
  secp256k1_scalar msg;
  secp256k1_scalar sk;
  secp256k1_scalar dleq_proof_e;
  secp256k1_scalar dleq_proof_s;
  secp256k1_ge adaptor_ge;
  secp256k1_ge rp;
  secp256k1_ge r;
  secp256k1_gej rpj;
  secp256k1_gej rj;
  secp256k1_scalar k;
  secp256k1_sha256 sha;
  uchar buf33 [33];
  uchar local_68 [8];
  uchar nonce32 [32];
  uchar *msg32_local;
  secp256k1_pubkey *adaptor_local;
  uchar *seckey32_local;
  uchar *adaptor_proof97_local;
  uchar *adaptor_sig65_local;
  secp256k1_context *ctx_local;
  
  iVar1 = secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx);
  if (iVar1 == 0) {
    secp256k1_callback_call
              (&ctx->illegal_callback,"secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx)")
    ;
  }
  else if (adaptor_sig65 == (uchar *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"adaptor_sig65 != NULL");
  }
  else if (adaptor_proof97 == (uchar *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"adaptor_proof97 != NULL");
  }
  else if (adaptor == (secp256k1_pubkey *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"adaptor != NULL");
  }
  else if (msg32 == (uchar *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"msg32 != NULL");
  }
  else {
    secp256k1_sha256_initialize((secp256k1_sha256 *)(k.d + 3));
    secp256k1_sha256_write((secp256k1_sha256 *)(k.d + 3),msg32,0x20);
    iVar1 = secp256k1_pubkey_load(ctx,(secp256k1_ge *)(dleq_proof_s.d + 3),adaptor);
    if (iVar1 != 0) {
      secp256k1_dleq_serialize_point((uchar *)&sha.bytes,(secp256k1_ge *)(dleq_proof_s.d + 3));
      secp256k1_sha256_write((secp256k1_sha256 *)(k.d + 3),(uchar *)&sha.bytes,0x21);
      secp256k1_sha256_finalize((secp256k1_sha256 *)(k.d + 3),(uchar *)&sha.bytes);
      iVar1 = nonce_function_dleq(local_68,(uchar *)&sha.bytes,seckey32,(uchar *)"ECDSAAdaptorNon");
      if (iVar1 != 0) {
        secp256k1_scalar_set_b32((secp256k1_scalar *)&rj.infinity,local_68,(int *)0x0);
        iVar1 = secp256k1_scalar_is_zero((secp256k1_scalar *)&rj.infinity);
        if (iVar1 == 0) {
          secp256k1_ecmult_gen
                    (&ctx->ecmult_gen_ctx,(secp256k1_gej *)&r.infinity,
                     (secp256k1_scalar *)&rj.infinity);
          secp256k1_ecmult_const
                    ((secp256k1_gej *)&rpj.infinity,(secp256k1_ge *)(dleq_proof_s.d + 3),
                     (secp256k1_scalar *)&rj.infinity,0x100);
          iVar1 = secp256k1_dleq_proof
                            (&ctx->ecmult_gen_ctx,(secp256k1_scalar *)(dleq_proof_e.d + 3),
                             (secp256k1_scalar *)(sk.d + 3),(uchar *)"ECDSAAdaptorSig",
                             (secp256k1_scalar *)&rj.infinity,(secp256k1_ge *)(dleq_proof_s.d + 3));
          if (iVar1 != 0) {
            secp256k1_ge_set_gej((secp256k1_ge *)&rp.infinity,(secp256k1_gej *)&rpj.infinity);
            secp256k1_scalar_set_b32((secp256k1_scalar *)(msg.d + 3),seckey32,&local_3cc);
            if ((local_3cc == 0) &&
               (iVar1 = secp256k1_scalar_is_zero((secp256k1_scalar *)(msg.d + 3)), iVar1 == 0)) {
              secp256k1_scalar_set_b32((secp256k1_scalar *)(sp.d + 3),msg32,(int *)0x0);
              iVar1 = secp256k1_ecdsa_adaptor_sign_helper
                                ((secp256k1_scalar *)local_3c8,(secp256k1_scalar *)(sp.d + 3),
                                 (secp256k1_scalar *)&rj.infinity,(secp256k1_ge *)&rp.infinity,
                                 (secp256k1_scalar *)(msg.d + 3));
              if (iVar1 != 0) {
                secp256k1_ge_set_gej
                          ((secp256k1_ge *)&adaptor_ge.infinity,(secp256k1_gej *)&r.infinity);
                secp256k1_ecdsa_adaptor_proof_serialize
                          (adaptor_proof97,(secp256k1_ge *)&adaptor_ge.infinity,
                           (secp256k1_scalar *)(dleq_proof_e.d + 3),(secp256k1_scalar *)(sk.d + 3));
                secp256k1_ecdsa_adaptor_sig_serialize
                          (adaptor_sig65,(secp256k1_ge *)&rp.infinity,(secp256k1_scalar *)local_3c8)
                ;
                secp256k1_scalar_clear((secp256k1_scalar *)&rj.infinity);
                secp256k1_scalar_clear((secp256k1_scalar *)(msg.d + 3));
                return 1;
              }
              secp256k1_scalar_clear((secp256k1_scalar *)&rj.infinity);
              secp256k1_scalar_clear((secp256k1_scalar *)(msg.d + 3));
              return 0;
            }
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

int secp256k1_ecdsa_adaptor_sign(const secp256k1_context* ctx, unsigned char *adaptor_sig65, unsigned char *adaptor_proof97, unsigned char *seckey32, const secp256k1_pubkey *adaptor, const unsigned char *msg32) {
    unsigned char nonce32[32];
    unsigned char buf33[33];
    secp256k1_sha256 sha;
    secp256k1_scalar k;
    secp256k1_gej rj, rpj;
    secp256k1_ge r, rp;
    secp256k1_ge adaptor_ge;
    secp256k1_scalar dleq_proof_s;
    secp256k1_scalar dleq_proof_e;
    secp256k1_scalar sk;
    secp256k1_scalar msg;
    secp256k1_scalar sp;
    int overflow;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx));
    ARG_CHECK(adaptor_sig65 != NULL);
    ARG_CHECK(adaptor_proof97 != NULL);
    ARG_CHECK(adaptor != NULL);
    ARG_CHECK(msg32 != NULL);

    /* 1. Choose k randomly, R' = k*G */
    /* Include msg32 and adaptor in nonce derivation */
    secp256k1_sha256_initialize(&sha);
    secp256k1_sha256_write(&sha, msg32, 32);
    if (!secp256k1_pubkey_load(ctx, &adaptor_ge, adaptor)) {
        return 0;
    }
    secp256k1_dleq_serialize_point(buf33, &adaptor_ge);
    secp256k1_sha256_write(&sha, buf33, 33);
    secp256k1_sha256_finalize(&sha, buf33);
    if (!nonce_function_dleq(nonce32, buf33, seckey32, (unsigned char *)"ECDSAAdaptorNon")) {
        return 0;
    }
    secp256k1_scalar_set_b32(&k, nonce32, NULL);
    if (secp256k1_scalar_is_zero(&k)) {
        return 0;
    }
    secp256k1_ecmult_gen(&ctx->ecmult_gen_ctx, &rpj, &k);

    /* 2. R = k*Y; */
    secp256k1_ecmult_const(&rj, &adaptor_ge, &k, 256);

    /* 4. [sic] proof = DLEQ_prove((G,R'),(Y, R)) */
    if (!secp256k1_dleq_proof(&ctx->ecmult_gen_ctx, &dleq_proof_s, &dleq_proof_e, (unsigned char *)"ECDSAAdaptorSig", &k, &adaptor_ge)) {
        return 0;
    }

    /* 5. s' = k⁻¹(H(m) + x_coord(R)x) */
    secp256k1_ge_set_gej(&r, &rj);
    secp256k1_scalar_set_b32(&sk, seckey32, &overflow);
    if (overflow || secp256k1_scalar_is_zero(&sk)) {
        return 0;
    }
    secp256k1_scalar_set_b32(&msg, msg32, NULL);
    if(!secp256k1_ecdsa_adaptor_sign_helper(&sp, &msg, &k, &r, &sk)) {
        secp256k1_scalar_clear(&k);
        secp256k1_scalar_clear(&sk);
        return 0;
    }

    /* 6. return (R, R', s', proof) */
    secp256k1_ge_set_gej(&rp, &rpj);
    secp256k1_ecdsa_adaptor_proof_serialize(adaptor_proof97, &rp, &dleq_proof_s, &dleq_proof_e);
    secp256k1_ecdsa_adaptor_sig_serialize(adaptor_sig65, &r, &sp);

    secp256k1_scalar_clear(&k);
    secp256k1_scalar_clear(&sk);
    return 1;
}